

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_mp3_init_file_w(wchar_t *pFilePath,ma_decoding_backend_config *pConfig,
                            ma_allocation_callbacks *pAllocationCallbacks,ma_mp3 *pMP3)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  
  mVar1 = ma_mp3_init_internal(pConfig,pMP3);
  if (mVar1 == MA_SUCCESS) {
    mVar2 = ma_dr_mp3_init_file_w(&pMP3->dr,pFilePath,pAllocationCallbacks);
    if (mVar2 == 0) {
      mVar1 = MA_INVALID_FILE;
    }
    else {
      ma_mp3_post_init(pMP3,pConfig,pAllocationCallbacks);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_mp3_init_file_w(const wchar_t* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_mp3* pMP3)
{
    ma_result result;

    result = ma_mp3_init_internal(pConfig, pMP3);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_init_file_w(&pMP3->dr, pFilePath, pAllocationCallbacks);
        if (mp3Result != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_mp3_post_init(pMP3, pConfig, pAllocationCallbacks);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}